

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O2

int vrf_part(part_t *part,int mode)

{
  long lVar1;
  char *pcVar2;
  
  lVar1 = tdefs[0].vtotal + part->partkey;
  for (pcVar2 = part->name; (long)*pcVar2 != 0; pcVar2 = pcVar2 + 1) {
    lVar1 = lVar1 + *pcVar2;
  }
  for (pcVar2 = part->mfgr; (long)*pcVar2 != 0; pcVar2 = pcVar2 + 1) {
    lVar1 = lVar1 + *pcVar2;
  }
  for (pcVar2 = part->brand; (long)*pcVar2 != 0; pcVar2 = pcVar2 + 1) {
    lVar1 = lVar1 + *pcVar2;
  }
  for (pcVar2 = part->type; (long)*pcVar2 != 0; pcVar2 = pcVar2 + 1) {
    lVar1 = lVar1 + *pcVar2;
  }
  tdefs[0].vtotal = lVar1 + part->size;
  for (pcVar2 = part->container; (long)*pcVar2 != 0; pcVar2 = pcVar2 + 1) {
    tdefs[0].vtotal = tdefs[0].vtotal + (long)*pcVar2;
  }
  for (pcVar2 = part->category; (long)*pcVar2 != 0; pcVar2 = pcVar2 + 1) {
    tdefs[0].vtotal = tdefs[0].vtotal + (long)*pcVar2;
  }
  return 0;
}

Assistant:

int
vrf_part(part_t *part, int mode)
{

    UNUSED(mode);
    VRF_STRT(PART);
    VRF_INT(PART, part->partkey);
    VRF_STR(PART, part->name);
    VRF_STR(PART, part->mfgr);
    VRF_STR(PART, part->brand);
    VRF_STR(PART, part->type);
    VRF_INT(PART, part->size);
    VRF_STR(PART, part->container);
    VRF_STR(PART, part->category);
    VRF_END(PART);

    return(0);
}